

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O0

bool __thiscall
graph_utils::
Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
::Unite(Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__return_storage_ptr__;
  ulong uVar1;
  unsigned_long uVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer ppVar5;
  pointer ppVar6;
  byte local_135;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_130;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_128;
  iterator v_rep_size_it;
  iterator u_rep_size_it;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_rep;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u_rep;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_local;
  Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
  *this_local;
  
  local_28 = v;
  v_local = u;
  u_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  Find(&local_50,this,u);
  bVar3 = std::optional::operator_cast_to_bool((optional *)&local_50);
  u_rep.field_2._M_local_buf[0xb] = '\0';
  local_135 = 1;
  if (bVar3) {
    Find(&local_78,this,local_28);
    u_rep.field_2._M_local_buf[0xb] = '\x01';
    bVar3 = std::optional::operator_cast_to_bool((optional *)&local_78);
    local_135 = bVar3 ^ 0xff;
  }
  if ((u_rep.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_78);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_50);
  if ((local_135 & 1) == 0) {
    __return_storage_ptr__ =
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(&v_rep.field_2._M_allocated_capacity + 1);
    Find(__return_storage_ptr__,this,v_local);
    pbVar4 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(__return_storage_ptr__);
    std::__cxx11::string::string((string *)local_a8,pbVar4);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(__return_storage_ptr__);
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&u_rep_size_it,this,local_28);
    pbVar4 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&u_rep_size_it);
    std::__cxx11::string::string((string *)local_f0,pbVar4);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&u_rep_size_it);
    bVar3 = TypeEqual(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0)
    ;
    if (bVar3) {
      this_local._7_1_ = 0;
    }
    else {
      v_rep_size_it =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find(&this->size_,(key_type *)local_a8);
      local_128._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find(&this->size_,(key_type *)local_f0);
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
               ::operator->(&v_rep_size_it);
      uVar1 = ppVar5->second;
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                             *)&local_128);
      if (uVar1 < ppVar5->second) {
        std::swap<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      }
      local_130._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->parent_,(key_type *)local_f0);
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_130);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&ppVar6->second,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                             *)&local_128);
      uVar2 = ppVar5->second;
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
               ::operator->(&v_rep_size_it);
      ppVar5->second = uVar2 + ppVar5->second;
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Unite(const Type& u, const Type& v) {
    if (!Find(u) || !Find(v))
      return false;
    Type u_rep = *Find(u);
    Type v_rep = *Find(v);
    if (!TypeEqual(u_rep, v_rep)) {
      auto u_rep_size_it = size_.find(u_rep);
      auto v_rep_size_it = size_.find(v_rep);
      if (u_rep_size_it->second < v_rep_size_it->second)
        std::swap(u_rep, v_rep);
      parent_.find(v_rep)->second = u_rep;
      u_rep_size_it->second += v_rep_size_it->second;
      return true;
    }
    return false;
  }